

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

ITracker * __thiscall
Catch::TestCaseTracking::TrackerBase::findChild(TrackerBase *this,string *name)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  __normal_iterator<Catch::Ptr<Catch::TestCaseTracking::ITracker>_*,_std::vector<Catch::Ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<Catch::Ptr<Catch::TestCaseTracking::ITracker>_>_>_>
  __last;
  pointer pcVar2;
  __normal_iterator<Catch::Ptr<Catch::TestCaseTracking::ITracker>_*,_std::vector<Catch::Ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<Catch::Ptr<Catch::TestCaseTracking::ITracker>_>_>_>
  _Var3;
  ITracker *pIVar4;
  TrackerHasName local_48;
  
  _Var3._M_current =
       (this->m_children).
       super__Vector_base<Catch::Ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<Catch::Ptr<Catch::TestCaseTracking::ITracker>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  __last._M_current =
       (this->m_children).
       super__Vector_base<Catch::Ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<Catch::Ptr<Catch::TestCaseTracking::ITracker>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  paVar1 = &local_48.m_name.field_2;
  pcVar2 = (name->_M_dataplus)._M_p;
  local_48.m_name._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar2,pcVar2 + name->_M_string_length);
  _Var3 = std::
          find_if<__gnu_cxx::__normal_iterator<Catch::Ptr<Catch::TestCaseTracking::ITracker>*,std::vector<Catch::Ptr<Catch::TestCaseTracking::ITracker>,std::allocator<Catch::Ptr<Catch::TestCaseTracking::ITracker>>>>,Catch::TestCaseTracking::TrackerBase::TrackerHasName>
                    (_Var3,__last,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48.m_name._M_dataplus._M_p != paVar1) {
    operator_delete(local_48.m_name._M_dataplus._M_p,
                    local_48.m_name.field_2._M_allocated_capacity + 1);
  }
  if (_Var3._M_current ==
      (this->m_children).
      super__Vector_base<Catch::Ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<Catch::Ptr<Catch::TestCaseTracking::ITracker>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pIVar4 = (ITracker *)0x0;
  }
  else {
    pIVar4 = (_Var3._M_current)->m_p;
  }
  return pIVar4;
}

Assistant:

virtual ITracker* findChild( std::string const& name ) CATCH_OVERRIDE {
            Children::const_iterator it = std::find_if( m_children.begin(), m_children.end(), TrackerHasName( name ) );
            return( it != m_children.end() )
                ? it->get()
                : CATCH_NULL;
        }